

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex
          (SubstitutionTreeClauseVariantIndex *this)

{
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_00;
  List<Kernel::Clause_*> **ppLVar1;
  size_t sVar2;
  bool bVar3;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar4;
  uint i;
  size_t n;
  IteratorBase local_38;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__SubstitutionTreeClauseVariantIndex_009ea160;
  this_00 = &this->_strees;
  sVar2 = (this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity;
  for (n = 0; (uint)sVar2 != n; n = n + 1) {
    ppLVar4 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                        (&this_00->
                          super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,
                         n);
    if (*ppLVar4 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
      ppLVar4 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                          (&this_00->
                            super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>
                           ,n);
      if (*ppLVar4 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        (*((*ppLVar4)->super_LiteralIndexingStructure<Indexing::LiteralClause>).
          _vptr_LiteralIndexingStructure[1])();
      }
    }
  }
  Lib::List<Kernel::Clause_*>::destroy(this->_emptyClauses);
  local_38._next = (this->_groundUnits)._entries;
  local_38._last = (this->_groundUnits)._afterLast;
  local_38._timestamp = (this->_groundUnits)._timestamp;
  while( true ) {
    bVar3 = Lib::
            DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::IteratorBase::hasNext(&local_38);
    if (!bVar3) break;
    ppLVar1 = &(local_38._next)->_val;
    local_38._next = local_38._next + 1;
    Lib::List<Kernel::Clause_*>::destroy(*ppLVar1);
  }
  Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::~Array
            (&this_00->super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>);
  Lib::DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_groundUnits);
  return;
}

Assistant:

SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex()
{
  unsigned streeArrSz=_strees.size();
  for(unsigned i=0;i<streeArrSz;i++) {
    if(_strees[i]!=0) {
      delete _strees[i];
    }
  }

  ClauseList::destroy(_emptyClauses);

  DHMap<Literal*, ClauseList*>::Iterator it(_groundUnits);
  while (it.hasNext()) {
    ClauseList::destroy(it.next());
  }
}